

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir-print.cc
# Opt level: O3

void __thiscall IR::Print::visit(Print *this,Move *m)

{
  char cVar1;
  tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *args;
  
  args = &((m->super_tuple<const_IR::Temp_*,_const_IR::Temp_*>).
           super__Tuple_impl<0UL,_const_IR::Temp_*,_const_IR::Temp_*>.
           super__Head_base<0UL,_const_IR::Temp_*,_false>._M_head_impl)->
          super_tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ;
  fmt::v7::print<char[11],std::__cxx11::string_const&,std::__cxx11::string_const&,char>
            (this->out,(char (*) [11])"{0} = {1};",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)args,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)args);
  cVar1 = (char)this->out;
  std::ios::widen((char)*(undefined8 *)(*(long *)this->out + -0x18) + cVar1);
  std::ostream::put(cVar1);
  std::ostream::flush();
  return;
}

Assistant:

void Print::visit(IR::Move* m) {
  fmt::print(out, "{0} = {1};", m->target()->name(), m->source()->name());
  out << std::endl;
}